

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O0

void __thiscall converterApp::loadFile(converterApp *this,string *file)

{
  bool bVar1;
  char *pcVar2;
  istream *piVar3;
  ulong uVar4;
  char cVar5;
  char *in_R9;
  double local_320;
  double value;
  undefined8 local_2f8;
  size_type snameend;
  string shortname;
  string name;
  size_type nameend;
  size_type namestartloc;
  size_type ploc;
  string line;
  string local_270;
  AssertHelper local_250;
  Message local_248 [3];
  undefined1 local_230 [8];
  AssertionResult gtest_ar_;
  ifstream input;
  string *file_local;
  converterApp *this_local;
  
  std::ifstream::ifstream(&gtest_ar_.message_,file,8);
  testing::AssertionResult::AssertionResult<std::ifstream>
            ((AssertionResult *)local_230,
             (basic_ifstream<char,_std::char_traits<char>_> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)local_230,(AssertionResult *)"input","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    testing::Message::~Message(local_248);
  }
  line.field_2._13_3_ = 0;
  line.field_2._M_local_buf[0xc] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  if (line.field_2._12_4_ == 0) {
    std::__cxx11::string::string((string *)&ploc);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&gtest_ar_.message_,(string *)&ploc);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cVar5 = (char)&ploc;
        std::__cxx11::string::find_first_of(cVar5,0x2e);
        std::__cxx11::string::find_first_not_of(cVar5,0x20);
        std::__cxx11::string::find_first_of((char *)&ploc,0x1ce755);
        std::__cxx11::string::substr((ulong)((long)&shortname.field_2 + 8),(ulong)&ploc);
        while (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 == ' ') {
          std::__cxx11::string::pop_back();
        }
        std::__cxx11::string::string((string *)&snameend);
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&ploc);
        if (*pcVar2 == '[') {
          local_2f8 = std::__cxx11::string::find_first_of((char)&ploc,0x5d);
          std::__cxx11::string::substr((ulong)&value,(ulong)&ploc);
          std::__cxx11::string::operator=((string *)&snameend,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
        }
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&gtest_ar_.message_,(string *)&ploc);
        local_320 = std::__cxx11::stod((string *)&ploc,(size_t *)0x0);
        std::vector<convValue,std::allocator<convValue>>::
        emplace_back<std::__cxx11::string&,std::__cxx11::string&,double&>
                  ((vector<convValue,std::allocator<convValue>> *)&this->unit_conv,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&shortname.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&snameend,
                   &local_320);
        std::__cxx11::string::~string((string *)&snameend);
        std::__cxx11::string::~string((string *)(shortname.field_2._M_local_buf + 8));
      }
    }
    std::__cxx11::string::~string((string *)&ploc);
    line.field_2._12_4_ = 0;
  }
  std::ifstream::~ifstream(&gtest_ar_.message_);
  return;
}

Assistant:

void loadFile(const std::string& file)
    {
        std::ifstream input(file);
        ASSERT_TRUE(input);
        std::string line;
        while (std::getline(input, line)) {
            if (line.empty()) {
                continue;
            }
            auto ploc = line.find_first_of('.');
            auto namestartloc = line.find_first_not_of(' ', ploc + 1);
            auto nameend = line.find_first_of("[:", namestartloc + 1);
            std::string name =
                line.substr(namestartloc, nameend - namestartloc);
            while (name.back() == ' ') {
                name.pop_back();
            }
            std::string shortname;
            if (line[nameend] == '[') {
                auto snameend = line.find_first_of(']', nameend + 1);
                shortname = line.substr(nameend + 1, snameend - nameend - 1);
            }
            std::getline(input, line);
            double value = stod(line);
            unit_conv.emplace_back(name, shortname, value);
        }
    }